

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxList::shiftHalf(BoxList *this,IntVect *iv)

{
  int *piVar1;
  uint uVar2;
  pointer pBVar3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  int i;
  long lVar4;
  Box *bx;
  pointer pBVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  __range1 = &this->m_lbox;
  pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar5 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar5 != pBVar3; pBVar5 = pBVar5 + 1) {
    lVar4 = 0;
    do {
      uVar6 = 1 << ((byte)lVar4 & 0x1f);
      uVar2 = iv->vect[lVar4];
      uVar7 = (pBVar5->btype).itype;
      uVar9 = uVar2 & 1;
      if (uVar9 != 0) {
        (pBVar5->btype).itype = uVar7 ^ uVar6;
      }
      uVar7 = uVar7 & uVar6;
      uVar6 = uVar9;
      if (uVar7 != 0) {
        uVar6 = 0;
        uVar7 = uVar9;
      }
      uVar7 = -uVar7;
      if (-1 < (int)uVar2) {
        uVar7 = uVar6;
      }
      iVar8 = uVar7 + (int)uVar2 / 2;
      piVar1 = (pBVar5->smallend).vect + lVar4;
      *piVar1 = *piVar1 + iVar8;
      piVar1 = (pBVar5->bigend).vect + lVar4;
      *piVar1 = *piVar1 + iVar8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  return (BoxList *)__range1;
}

Assistant:

BoxList&
BoxList::shiftHalf (const IntVect& iv)
{
    for (auto& bx : m_lbox)
    {
        bx.shiftHalf(iv);
    }
    return *this;
}